

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

void tpl_model_update_b(TplParams *tpl_data,int mi_row,int mi_col,BLOCK_SIZE bsize,int frame_idx,
                       int ref)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  TplDepFrame *pTVar6;
  TplDepStats *pTVar7;
  TplDepStats *pTVar8;
  long recrf_dist;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int32_t *piVar16;
  int64_t iVar17;
  byte bVar18;
  byte bVar19;
  long lVar20;
  uint uVar21;
  int64_t *piVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int pix_num;
  int iVar31;
  bool bVar32;
  
  pTVar6 = tpl_data->tpl_frame;
  bVar1 = tpl_data->tpl_stats_block_mis_log2;
  pTVar7 = pTVar6[(uint)frame_idx].tpl_stats_ptr;
  iVar28 = (mi_col >> (bVar1 & 0x1f)) + (mi_row >> (bVar1 & 0x1f)) * pTVar6->stride;
  lVar20 = (long)pTVar7[iVar28].ref_frame_index[(uint)ref];
  if ((-1 < lVar20) && (lVar15 = (long)pTVar6[(uint)frame_idx].ref_map_index[lVar20], -1 < lVar15))
  {
    uVar12 = (uint)pTVar7[iVar28].mv[lVar20].as_mv.row;
    uVar13 = (uint)*(short *)((long)pTVar7[iVar28].mv + lVar20 * 4 + 2);
    iVar30 = 4 << (""[bsize] & 0x1f);
    uVar12 = ((int)((uVar12 - ((int)~uVar12 >> 0x1f)) + 3) >> 3) + mi_row * 4;
    iVar31 = 4 << (""[bsize] & 0x1f);
    uVar13 = ((int)((uVar13 - ((int)~uVar13 >> 0x1f)) + 3) >> 3) + mi_col * 4;
    bVar18 = ""[bsize] + 2;
    pix_num = iVar31 * iVar30;
    uVar9 = uVar12 >> (bVar18 & 0x1f);
    if ((int)uVar12 < 0) {
      uVar9 = (int)uVar12 >> (bVar18 & 0x1f);
    }
    bVar19 = ""[bsize] + 2;
    uVar25 = uVar13 >> (bVar19 & 0x1f);
    if ((int)uVar13 < 0) {
      uVar25 = (int)uVar13 >> (bVar19 & 0x1f);
    }
    bVar32 = pTVar7[iVar28].ref_frame_index[1] < '\0';
    pTVar8 = pTVar6[lVar15].tpl_stats_ptr;
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
    piVar22 = pTVar7[iVar28].cmp_recrf_dist + (ref == 0);
    if (bVar32) {
      piVar22 = &pTVar7[iVar28].srcrf_dist;
    }
    piVar16 = pTVar7[iVar28].cmp_recrf_rate + (ref == 0);
    if (bVar32) {
      piVar16 = &pTVar7[iVar28].srcrf_rate;
    }
    iVar4 = *piVar16;
    iVar5 = pTVar7[iVar28].recrf_rate;
    lVar20 = pTVar7[iVar28].mc_dep_dist;
    recrf_dist = pTVar7[iVar28].recrf_dist;
    lVar24 = recrf_dist - *piVar22;
    iVar17 = av1_delta_rate_cost(pTVar7[iVar28].mc_dep_rate,recrf_dist,*piVar22,pix_num);
    uVar27 = 0;
    do {
      uVar14 = ((uVar27 >> 1) + uVar9) * iVar31;
      iVar28 = 0;
      if ((uVar27 & 1) != 0) {
        iVar28 = iVar30;
      }
      if ((((-1 < (int)uVar14) && ((int)uVar14 < pTVar6[lVar15].mi_rows * 4)) &&
          (uVar21 = iVar28 + uVar25 * iVar30, -1 < (int)uVar21)) &&
         ((int)uVar21 < pTVar6[lVar15].mi_cols * 4)) {
        uVar10 = uVar12;
        if ((int)uVar12 < (int)uVar14) {
          uVar10 = uVar14;
        }
        uVar29 = uVar12;
        if ((int)uVar14 < (int)uVar12) {
          uVar29 = uVar14;
        }
        uVar11 = uVar13;
        if ((int)uVar13 < (int)uVar21) {
          uVar11 = uVar21;
        }
        uVar23 = uVar13;
        if ((int)uVar21 < (int)uVar13) {
          uVar23 = uVar21;
        }
        lVar26 = (long)(int)(((uVar23 + iVar30) - uVar11) * ((uVar29 + iVar31) - uVar10));
        if ((int)(uVar23 + iVar30) <= (int)uVar11) {
          lVar26 = 0;
        }
        if ((int)(uVar29 + iVar31) <= (int)uVar10) {
          lVar26 = 0;
        }
        iVar28 = ((uVar21 >> (bVar19 & 0x1f)) * (uint)bVar3 >> (bVar1 & 0x1f)) +
                 ((uVar14 >> (bVar18 & 0x1f)) * (uint)bVar2 >> (bVar1 & 0x1f)) *
                 pTVar6[lVar15].stride;
        piVar22 = &pTVar8[iVar28].mc_dep_dist;
        *piVar22 = *piVar22 +
                   (lVar26 * ((long)(((double)lVar24 / (double)recrf_dist) * (double)lVar20) +
                             lVar24)) / (long)pix_num;
        piVar22 = &pTVar8[iVar28].mc_dep_rate;
        *piVar22 = *piVar22 +
                   (lVar26 * (iVar17 + ((long)(iVar5 << 4) - (long)(iVar4 << 4)))) / (long)pix_num;
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != 4);
  }
  return;
}

Assistant:

static inline void tpl_model_update_b(TplParams *const tpl_data, int mi_row,
                                      int mi_col, const BLOCK_SIZE bsize,
                                      int frame_idx, int ref) {
  TplDepFrame *tpl_frame_ptr = &tpl_data->tpl_frame[frame_idx];
  TplDepStats *tpl_ptr = tpl_frame_ptr->tpl_stats_ptr;
  TplDepFrame *tpl_frame = tpl_data->tpl_frame;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  TplDepStats *tpl_stats_ptr = &tpl_ptr[av1_tpl_ptr_pos(
      mi_row, mi_col, tpl_frame->stride, block_mis_log2)];

  int is_compound = tpl_stats_ptr->ref_frame_index[1] >= 0;

  if (tpl_stats_ptr->ref_frame_index[ref] < 0) return;
  const int ref_frame_index = tpl_stats_ptr->ref_frame_index[ref];
  TplDepFrame *ref_tpl_frame =
      &tpl_frame[tpl_frame[frame_idx].ref_map_index[ref_frame_index]];
  TplDepStats *ref_stats_ptr = ref_tpl_frame->tpl_stats_ptr;

  if (tpl_frame[frame_idx].ref_map_index[ref_frame_index] < 0) return;

  const FULLPEL_MV full_mv =
      get_fullmv_from_mv(&tpl_stats_ptr->mv[ref_frame_index].as_mv);
  const int ref_pos_row = mi_row * MI_SIZE + full_mv.row;
  const int ref_pos_col = mi_col * MI_SIZE + full_mv.col;

  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  const int mi_height = mi_size_high[bsize];
  const int mi_width = mi_size_wide[bsize];
  const int pix_num = bw * bh;

  // top-left on grid block location in pixel
  int grid_pos_row_base = round_floor(ref_pos_row, bh) * bh;
  int grid_pos_col_base = round_floor(ref_pos_col, bw) * bw;
  int block;

  int64_t srcrf_dist = is_compound ? tpl_stats_ptr->cmp_recrf_dist[!ref]
                                   : tpl_stats_ptr->srcrf_dist;
  int64_t srcrf_rate =
      is_compound
          ? (tpl_stats_ptr->cmp_recrf_rate[!ref] << TPL_DEP_COST_SCALE_LOG2)
          : (tpl_stats_ptr->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);

  int64_t cur_dep_dist = tpl_stats_ptr->recrf_dist - srcrf_dist;
  int64_t mc_dep_dist =
      (int64_t)(tpl_stats_ptr->mc_dep_dist *
                ((double)(tpl_stats_ptr->recrf_dist - srcrf_dist) /
                 tpl_stats_ptr->recrf_dist));
  int64_t delta_rate =
      (tpl_stats_ptr->recrf_rate << TPL_DEP_COST_SCALE_LOG2) - srcrf_rate;
  int64_t mc_dep_rate =
      av1_delta_rate_cost(tpl_stats_ptr->mc_dep_rate, tpl_stats_ptr->recrf_dist,
                          srcrf_dist, pix_num);

  for (block = 0; block < 4; ++block) {
    int grid_pos_row = grid_pos_row_base + bh * (block >> 1);
    int grid_pos_col = grid_pos_col_base + bw * (block & 0x01);

    if (grid_pos_row >= 0 && grid_pos_row < ref_tpl_frame->mi_rows * MI_SIZE &&
        grid_pos_col >= 0 && grid_pos_col < ref_tpl_frame->mi_cols * MI_SIZE) {
      int overlap_area = av1_get_overlap_area(grid_pos_row, grid_pos_col,
                                              ref_pos_row, ref_pos_col, bw, bh);
      int ref_mi_row = round_floor(grid_pos_row, bh) * mi_height;
      int ref_mi_col = round_floor(grid_pos_col, bw) * mi_width;
      assert((1 << block_mis_log2) == mi_height);
      assert((1 << block_mis_log2) == mi_width);
      TplDepStats *des_stats = &ref_stats_ptr[av1_tpl_ptr_pos(
          ref_mi_row, ref_mi_col, ref_tpl_frame->stride, block_mis_log2)];
      des_stats->mc_dep_dist +=
          ((cur_dep_dist + mc_dep_dist) * overlap_area) / pix_num;
      des_stats->mc_dep_rate +=
          ((delta_rate + mc_dep_rate) * overlap_area) / pix_num;
    }
  }
}